

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<false,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint32_t uVar9;
  undefined1 auVar10 [12];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar11;
  MessageLite *msg_00;
  ulong uVar12;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar14;
  uint uVar15;
  ParseContext *extraout_RDX;
  ParseContext *pPVar16;
  RepeatedPtrFieldBase *ptr_00;
  RepeatedPtrFieldBase *ptr_01;
  uint *puVar17;
  uint32_t uVar18;
  pair<const_char_*,_unsigned_int> pVar19;
  RepeatedPtrFieldBase *local_58;
  TcParser local_48 [16];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_38;
  
  puVar17 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar17 & 3) != 0) {
LAB_004466f3:
    AlignFail();
  }
  uVar5 = *(ushort *)((long)puVar17 + 10);
  if ((uVar5 & 0x30) == 0x20) {
    if ((uVar5 & 0x1c0) == 0x40) {
      if ((data.field_0._0_4_ & 7) != 3) {
        UNRECOVERED_JUMPTABLE = table->fallback;
LAB_00446658:
        pcVar13 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
        return pcVar13;
      }
      local_58 = (RepeatedPtrFieldBase *)((long)&msg->_vptr_MessageLite + (ulong)*puVar17);
      if (((ulong)local_58 & 7) == 0) {
        table_00 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                    ((long)&table->has_bits_offset +
                    (ulong)(ushort)puVar17[2] * 8 + (ulong)table->aux_offset);
        aVar14._0_4_ = uVar5 >> 9 & 3;
        aVar14.data._4_4_ = 0;
        ptr_00 = (RepeatedPtrFieldBase *)ptr;
        aVar11 = data.field_0;
        if ((short)aVar14._0_4_ != 2) {
          if ((uVar5 >> 9 & 3) == 0) {
            MpRepeatedMessageOrGroup<false,true>(local_48);
            goto LAB_00446740;
          }
          if (aVar14._0_4_ != 1) {
            table_00.data = *table_00.data;
          }
          table_00.data = (uint64_t)MessageLite::GetTcParseTable(table_00.data);
          aVar11 = data.field_0;
        }
        do {
          local_38 = aVar11;
          ptr_01 = local_58;
          msg_00 = AddMessage((TcParseTableBase *)table_00,local_58);
          iVar6 = ctx->depth_;
          ctx->depth_ = iVar6 + -1;
          pPVar16 = ctx;
          if (iVar6 < 1) {
LAB_00446684:
            pcVar13 = Error(msg,(char *)ptr_01,pPVar16,(TcFieldData)aVar14,table,hasbits);
            return pcVar13;
          }
          iVar7 = ctx->group_depth_;
          uVar15 = iVar7 + 1;
          ctx->group_depth_ = uVar15;
          aVar14 = table_00;
          ptr = ParseLoopPreserveNone(msg_00,(char *)ptr_00,ctx,(TcParseTableBase *)table_00);
          pPVar16 = extraout_RDX;
          if ((ushort *)ptr == (ushort *)0x0) {
            uVar1 = ctx->depth_;
            uVar2 = ctx->group_depth_;
            ctx->depth_ = uVar1 + 1;
            ctx->group_depth_ = uVar2 + -1;
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
            ptr_01 = ptr_00;
            goto LAB_00446684;
          }
          if (iVar6 + -1 != ctx->depth_) {
            MpRepeatedMessageOrGroup<false,true>();
LAB_004466e6:
            MpRepeatedMessageOrGroup<false,true>();
            goto LAB_004466f3;
          }
          uVar8 = ctx->group_depth_;
          if (uVar15 != uVar8) goto LAB_004466e6;
          ctx->group_depth_ = iVar7;
          ctx->depth_ = iVar6;
          uVar9 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          aVar14 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
          ptr_01 = (RepeatedPtrFieldBase *)(ulong)uVar8;
          if (((ushort *)ptr == (ushort *)0x0) ||
             (uVar18 = (uint32_t)local_38.data, uVar9 != uVar18)) goto LAB_00446684;
          if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_004466a6;
          bVar3 = (byte)*(ushort *)ptr;
          auVar10[8] = bVar3;
          auVar10._0_8_ = (byte *)((long)ptr + 1);
          auVar10._9_3_ = 0;
          if ((char)bVar3 < '\0') {
            bVar4 = *(byte *)((long)ptr + 1);
            aVar14.data = (ulong)bVar4 << 7;
            uVar15 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
            if ((char)bVar4 < '\0') {
              ptr_01 = (RepeatedPtrFieldBase *)(ulong)uVar15;
              pVar19 = ReadTagFallback(ptr,uVar15);
              auVar10 = pVar19._0_12_;
              pPVar16 = pVar19._8_8_;
              if (pVar19.first == (char *)0x0) goto LAB_00446684;
            }
            else {
              auVar10._8_4_ = uVar15;
              auVar10._0_8_ = (ushort *)((long)ptr + 2);
            }
          }
          ptr_00 = auVar10._0_8_;
          aVar11 = local_38;
        } while (auVar10._8_4_ == uVar18);
        if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
LAB_004466a6:
          if ((ulong)table->has_bits_offset != 0) {
            puVar17 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
            if (((ulong)puVar17 & 3) != 0) goto LAB_004466f3;
            *puVar17 = *puVar17 | (uint)hasbits;
          }
          return (char *)(ushort *)ptr;
        }
        uVar15 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
        if ((uVar15 & 7) != 0) {
LAB_00446740:
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar12 = (ulong)(uVar15 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar12 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar12);
        goto LAB_00446658;
      }
      goto LAB_00446710;
    }
  }
  else {
    MpRepeatedMessageOrGroup<false,true>();
  }
  MpRepeatedMessageOrGroup<false,true>();
LAB_00446710:
  AlignFail(local_58);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}